

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

bool __thiscall
gui::MultilineTextBox::handleMouseWheelScroll
          (MultilineTextBox *this,Wheel wheel,float delta,Vector2f *mouseParent)

{
  bool bVar1;
  Vector2f *in_RDX;
  Wheel in_ESI;
  Widget *in_RDI;
  float in_XMM0_Da;
  bool shiftKeyPressed;
  bool in_stack_00000037;
  int in_stack_00000038;
  bool in_stack_0000003f;
  MultilineTextBox *in_stack_00000040;
  
  bVar1 = Widget::handleMouseWheelScroll(in_RDI,in_ESI,in_XMM0_Da,in_RDX);
  if (!bVar1) {
    bVar1 = sf::Keyboard::isKeyPressed(A);
    if (!bVar1) {
      sf::Keyboard::isKeyPressed(A);
    }
    std::round((double)(ulong)(uint)in_XMM0_Da);
    updateScroll(in_stack_00000040,in_stack_0000003f,in_stack_00000038,in_stack_00000037);
  }
  return true;
}

Assistant:

bool MultilineTextBox::handleMouseWheelScroll(sf::Mouse::Wheel wheel, float delta, const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseWheelScroll(wheel, delta, mouseParent)) {
        return true;
    }
    const bool shiftKeyPressed = sf::Keyboard::isKeyPressed(sf::Keyboard::LShift) || sf::Keyboard::isKeyPressed(sf::Keyboard::RShift);
    updateScroll(!shiftKeyPressed, static_cast<int>(std::round(delta)) * 3, false);
    return true;
}